

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O2

void __thiscall
wasm::ModuleUtils::
ParallelFunctionAnalysis<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
::ParallelFunctionAnalysis::Mapper::~Mapper(Mapper *this)

{
  *(undefined ***)this = &PTR__Mapper_00e210a0;
  std::_Function_base::~_Function_base((_Function_base *)(this + 0x118));
  WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>::~WalkerPass
            ((WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_> *)this);
  return;
}

Assistant:

bool modifiesBinaryenIR() override { return Mut; }